

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void put1bitcmaptile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                    int32_t fromskew,int32_t toskew,uchar *pp)

{
  uint32_t **ppuVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uchar *puVar4;
  uint local_3c;
  uint32_t *puStack_38;
  uint32_t _x;
  uint32_t *bw;
  uint32_t **PALmap;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  ppuVar1 = img->PALmap;
  PALmap._0_4_ = h;
  _y_local = cp;
  do {
    local_3c = w;
    if ((uint32_t)PALmap == 0) {
      return;
    }
    for (; 7 < local_3c; local_3c = local_3c - 8) {
      puVar2 = ppuVar1[*pp];
      *_y_local = *puVar2;
      _y_local[1] = puVar2[1];
      _y_local[2] = puVar2[2];
      _y_local[3] = puVar2[3];
      _y_local[4] = puVar2[4];
      _y_local[5] = puVar2[5];
      puVar3 = _y_local + 7;
      _y_local[6] = puVar2[6];
      _y_local = _y_local + 8;
      *puVar3 = puVar2[7];
      pp = pp + 1;
    }
    if (local_3c != 0) {
      puVar4 = pp + 1;
      puVar2 = ppuVar1[*pp];
      pp = puVar4;
      puStack_38 = puVar2;
      switch(local_3c) {
      case 7:
        puStack_38 = puVar2 + 1;
        *_y_local = *puVar2;
        _y_local = _y_local + 1;
      case 6:
        *_y_local = *puStack_38;
        puStack_38 = puStack_38 + 1;
        _y_local = _y_local + 1;
      case 5:
        *_y_local = *puStack_38;
        puStack_38 = puStack_38 + 1;
        _y_local = _y_local + 1;
      case 4:
        *_y_local = *puStack_38;
        puStack_38 = puStack_38 + 1;
        _y_local = _y_local + 1;
      case 3:
        *_y_local = *puStack_38;
        puStack_38 = puStack_38 + 1;
        _y_local = _y_local + 1;
      case 2:
        *_y_local = *puStack_38;
        puStack_38 = puStack_38 + 1;
        _y_local = _y_local + 1;
      case 1:
        *_y_local = *puStack_38;
        _y_local = _y_local + 1;
      }
    }
    _y_local = _y_local + toskew;
    pp = pp + fromskew / 8;
    PALmap._0_4_ = (uint32_t)PALmap - 1;
  } while( true );
}

Assistant:

DECLAREContigPutFunc(put1bitcmaptile)
{
    uint32_t **PALmap = img->PALmap;

    (void)x;
    (void)y;
    fromskew /= 8;
    for (; h > 0; --h)
    {
        uint32_t *bw;
        UNROLL8(w, bw = PALmap[*pp++], *cp++ = *bw++);
        cp += toskew;
        pp += fromskew;
    }
}